

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-shm-server.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *__src;
  int __fd;
  char *__dest;
  size_t sVar1;
  int iVar2;
  long lVar3;
  
  __fd = shm_open("/AOS",0x42,0x1b6);
  if (__fd != 1) {
    ftruncate(__fd,0x28);
    iVar2 = 1;
    __dest = (char *)mmap((void *)0x0,0x1000,3,1,__fd,0);
    if (__dest == (char *)0xffffffffffffffff) {
      puts("Map failed");
    }
    else {
      lVar3 = 0;
      do {
        __src = *(char **)((long)&PTR_anon_var_dwarf_45_00103dd0 + lVar3);
        strcpy(__dest,__src);
        sVar1 = strlen(__src);
        __dest = __dest + sVar1;
        lVar3 = lVar3 + 8;
      } while (lVar3 != 0x28);
      munmap(__dest,0x1000);
      iVar2 = 0;
    }
    return iVar2;
  }
  puts("Shared memory segment failed");
  exit(1);
}

Assistant:

int main (int argc, char *argv[]) 
{
    const char * shm_name  = "/AOS";
    const int SIZE = 4096;
    const char * message[] = {"This ","is ","about ","shared ","memory"};
    int i, shm_fd;
    void * ptr;
    
    // ******** shm_open() ***************////// 
    //   shm_open()- opening/creation of a shared memory segment referenced by a name
    //        1) A special file will appear in the file-system under “/dev/shm/” with the provided name.
    //        2) The special file represents a POSIX object and it is created for persistence 
    //        3) ftruncate(...) function resize to memory region to the correct size
    
    shm_fd = shm_open(shm_name, O_CREAT | O_RDWR, 0666);
    
    if (shm_fd==1) 
    {
        printf("Shared memory segment failed\n");
        exit(1);
    }
    
    ftruncate(shm_fd, sizeof(message));
    
    // ******** shm_open() end ***************////// 
    
    // ******** mmap() ***************////// 
    // ******** mmap() – mapping of the memory segment referenced by the file descriptor returned by shm_open() ***************////// 
    
    ptr = mmap(0, SIZE, PROT_READ | PROT_WRITE, MAP_SHARED, shm_fd, 0);
    
    if (ptr == MAP_FAILED) 
    {
        printf("Map failed\n");
        return 1;
        
    }
    /* Write into the memory segment */
    for (i = 0; i < strlen(*message); ++i) 
    {
        sprintf(ptr, "%s", message[i]);
        ptr += strlen(message[i]);
        
    }
    // ******** munmap() ***************////// 
    // ******** munmap() – unmapping of the memory segment ***************////// 
    munmap(ptr, SIZE);
    
    return 0;
}